

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_block.cc
# Opt level: O2

void __thiscall Funcdata::pushBranch(Funcdata *this,BlockBasic *bb,int4 slot,BlockBasic *bbnew)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LowlevelError *pLVar2;
  allocator local_49;
  string local_48;
  PcodeOp *op;
  
  iVar1 = (*(bb->super_FlowBlock)._vptr_FlowBlock[0xe])(bb);
  op = (PcodeOp *)CONCAT44(extraout_var,iVar1);
  if (op->opcode->opcode == CPUI_CBRANCH) {
    if ((int)(((long)(bb->super_FlowBlock).outofthis.
                     super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(bb->super_FlowBlock).outofthis.
                    super__Vector_base<BlockEdge,_std::allocator<BlockEdge>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18) == 2) {
      iVar1 = (*(bbnew->super_FlowBlock)._vptr_FlowBlock[0xe])(bbnew);
      if (*(int *)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x10) == 6) {
        opRemoveInput(this,op,1);
        opSetOpcode(this,op,CPUI_BRANCH);
        BlockGraph::moveOutEdge(&this->bblocks,&bb->super_FlowBlock,slot,&bbnew->super_FlowBlock);
        structureReset(this);
        return;
      }
      pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&local_48,"Can only push branch into indirect jump",&local_49);
      LowlevelError::LowlevelError(pLVar2,&local_48);
      __cxa_throw(pLVar2,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_48,"Cannot push non-conditional edge",&local_49);
  LowlevelError::LowlevelError(pLVar2,&local_48);
  __cxa_throw(pLVar2,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void Funcdata::pushBranch(BlockBasic *bb,int4 slot,BlockBasic *bbnew)

{
  PcodeOp *cbranch = bb->lastOp();
  if ((cbranch->code() != CPUI_CBRANCH)||(bb->sizeOut() != 2))
    throw LowlevelError("Cannot push non-conditional edge");
  PcodeOp *indop = bbnew->lastOp();
  if (indop->code() != CPUI_BRANCHIND)
    throw LowlevelError("Can only push branch into indirect jump");

  // Turn the conditional branch into a branch
  opRemoveInput(cbranch,1);	// Remove the conditional variable
  opSetOpcode(cbranch,CPUI_BRANCH);
  bblocks.moveOutEdge(bb,slot,bbnew);
  // No change needs to be made to the indirect branch
  // we assume it handles its new branch implicitly
  structureReset();
}